

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O3

TestCaseGroup * vkt::api::createCommandBuffersTests(TestContext *testCtx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestContext *pTVar3;
  TestNode *this;
  TestNode *pTVar4;
  string local_70;
  string local_50;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"command_buffers","Command Buffers Tests");
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"pool_create_null_params","");
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::createPoolNullParamsTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"pool_create_non_null_allocator","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::createPoolNonNullAllocatorTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"pool_create_transient_bit","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::createPoolTransientBitTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"pool_create_reset_bit","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::createPoolResetBitTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"pool_reset_release_res","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::resetPoolReleaseResourcesBitTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"pool_reset_no_flags_res","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::resetPoolNoFlagsTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"pool_reset_reuse","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::resetPoolReuseTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"allocate_single_primary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::allocatePrimaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"allocate_many_primary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::allocateManyPrimaryBuffersTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"allocate_single_secondary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::allocateSecondaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"allocate_many_secondary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::allocateManySecondaryBuffersTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"execute_small_primary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::executePrimaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"execute_large_primary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::executeLargePrimaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"reset_implicit","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::resetBufferImplicitlyTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"trim_command_pool","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar4 = (TestNode *)
           createFunctionCase<vk::VkCommandBufferLevel>
                     (this->m_testCtx,NODETYPE_SELF_VALIDATE,&local_50,&local_70,
                      anon_unknown_0::trimCommandPoolTest,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"trim_command_pool_secondary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar4 = (TestNode *)
           createFunctionCase<vk::VkCommandBufferLevel>
                     (this->m_testCtx,NODETYPE_SELF_VALIDATE,&local_50,&local_70,
                      anon_unknown_0::trimCommandPoolTest,VK_COMMAND_BUFFER_LEVEL_SECONDARY);
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"record_single_primary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::recordSinglePrimaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"record_many_primary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::recordLargePrimaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"record_single_secondary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::recordSingleSecondaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"record_many_secondary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::recordLargeSecondaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"submit_twice_primary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::submitPrimaryBufferTwiceTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"submit_twice_secondary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::submitSecondaryBufferTwiceTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"record_one_time_submit_primary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::oneTimeSubmitFlagPrimaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"record_one_time_submit_secondary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::oneTimeSubmitFlagSecondaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"render_pass_continue","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::renderPassContinueTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"record_simul_use_primary","")
  ;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::simultaneousUsePrimaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"record_simul_use_secondary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::simultaneousUseSecondaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"record_simul_use_secondary_one_primary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d221b0;
  pTVar4[1]._vptr_TestNode = (_func_int **)anon_unknown_0::genComputeIncrementSource;
  pTVar4[1].m_testCtx =
       (TestContext *)anon_unknown_0::simultaneousUseSecondaryBufferOnePrimaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"record_simul_use_secondary_two_primary","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d221b0;
  pTVar4[1]._vptr_TestNode = (_func_int **)anon_unknown_0::genComputeIncrementSource;
  pTVar4[1].m_testCtx =
       (TestContext *)anon_unknown_0::simultaneousUseSecondaryBufferTwoPrimaryBuffersTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"record_query_precise_w_flag","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::recordBufferQueryPreciseWithFlagTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"record_query_imprecise_w_flag","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::recordBufferQueryImpreciseWithFlagTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"record_query_imprecise_wo_flag","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::recordBufferQueryImpreciseWithoutFlagTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"submit_count_non_zero","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::submitBufferCountNonZero;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"submit_count_equal_zero","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::submitBufferCountEqualZero;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"submit_wait_single_semaphore","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::submitBufferWaitSingleSemaphore;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"submit_wait_many_semaphores","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::submitBufferWaitManySemaphores;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"submit_null_fence","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::submitBufferNullFence;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"secondary_execute","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::executeSecondaryBufferTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"secondary_execute_twice","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::executeSecondaryBufferTwiceTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"order_bind_pipeline","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  pTVar3 = this->m_testCtx;
  pTVar4 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar4,pTVar3,NODETYPE_SELF_VALIDATE,local_50._M_dataplus._M_p,
             local_70._M_dataplus._M_p);
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d221b0;
  pTVar4[1]._vptr_TestNode = (_func_int **)anon_unknown_0::genComputeSource;
  pTVar4[1].m_testCtx = (TestContext *)anon_unknown_0::orderBindPipelineTest;
  tcu::TestNode::addChild(this,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createCommandBuffersTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	commandBuffersTests	(new tcu::TestCaseGroup(testCtx, "command_buffers", "Command Buffers Tests"));

	/* 19.1. Command Pools (5.1 in VK 1.0 Spec) */
	addFunctionCase				(commandBuffersTests.get(), "pool_create_null_params",			"",	createPoolNullParamsTest);
	addFunctionCase				(commandBuffersTests.get(), "pool_create_non_null_allocator",	"",	createPoolNonNullAllocatorTest);
	addFunctionCase				(commandBuffersTests.get(), "pool_create_transient_bit",		"",	createPoolTransientBitTest);
	addFunctionCase				(commandBuffersTests.get(), "pool_create_reset_bit",			"",	createPoolResetBitTest);
	addFunctionCase				(commandBuffersTests.get(), "pool_reset_release_res",			"",	resetPoolReleaseResourcesBitTest);
	addFunctionCase				(commandBuffersTests.get(), "pool_reset_no_flags_res",			"",	resetPoolNoFlagsTest);
	addFunctionCase				(commandBuffersTests.get(), "pool_reset_reuse",					"",	resetPoolReuseTest);
	/* 19.2. Command Buffer Lifetime (5.2 in VK 1.0 Spec) */
	addFunctionCase				(commandBuffersTests.get(), "allocate_single_primary",			"", allocatePrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "allocate_many_primary",			"",	allocateManyPrimaryBuffersTest);
	addFunctionCase				(commandBuffersTests.get(), "allocate_single_secondary",		"", allocateSecondaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "allocate_many_secondary",			"", allocateManySecondaryBuffersTest);
	addFunctionCase				(commandBuffersTests.get(), "execute_small_primary",			"",	executePrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "execute_large_primary",			"",	executeLargePrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "reset_implicit",					"", resetBufferImplicitlyTest);
	addFunctionCase				(commandBuffersTests.get(), "trim_command_pool",				"", trimCommandPoolTest, VK_COMMAND_BUFFER_LEVEL_PRIMARY);
	addFunctionCase				(commandBuffersTests.get(), "trim_command_pool_secondary",		"", trimCommandPoolTest, VK_COMMAND_BUFFER_LEVEL_SECONDARY);
	/* 19.3. Command Buffer Recording (5.3 in VK 1.0 Spec) */
	addFunctionCase				(commandBuffersTests.get(), "record_single_primary",			"",	recordSinglePrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "record_many_primary",				"", recordLargePrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "record_single_secondary",			"",	recordSingleSecondaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "record_many_secondary",			"", recordLargeSecondaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "submit_twice_primary",				"",	submitPrimaryBufferTwiceTest);
	addFunctionCase				(commandBuffersTests.get(), "submit_twice_secondary",			"",	submitSecondaryBufferTwiceTest);
	addFunctionCase				(commandBuffersTests.get(), "record_one_time_submit_primary",	"",	oneTimeSubmitFlagPrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "record_one_time_submit_secondary",	"",	oneTimeSubmitFlagSecondaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "render_pass_continue",				"",	renderPassContinueTest);
	addFunctionCase				(commandBuffersTests.get(), "record_simul_use_primary",			"",	simultaneousUsePrimaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "record_simul_use_secondary",		"",	simultaneousUseSecondaryBufferTest);
	addFunctionCaseWithPrograms (commandBuffersTests.get(), "record_simul_use_secondary_one_primary", "", genComputeIncrementSource, simultaneousUseSecondaryBufferOnePrimaryBufferTest);
	addFunctionCaseWithPrograms (commandBuffersTests.get(), "record_simul_use_secondary_two_primary", "", genComputeIncrementSource, simultaneousUseSecondaryBufferTwoPrimaryBuffersTest);
	addFunctionCase				(commandBuffersTests.get(), "record_query_precise_w_flag",		"",	recordBufferQueryPreciseWithFlagTest);
	addFunctionCase				(commandBuffersTests.get(), "record_query_imprecise_w_flag",	"",	recordBufferQueryImpreciseWithFlagTest);
	addFunctionCase				(commandBuffersTests.get(), "record_query_imprecise_wo_flag",	"",	recordBufferQueryImpreciseWithoutFlagTest);
	/* 19.4. Command Buffer Submission (5.4 in VK 1.0 Spec) */
	addFunctionCase				(commandBuffersTests.get(), "submit_count_non_zero",			"", submitBufferCountNonZero);
	addFunctionCase				(commandBuffersTests.get(), "submit_count_equal_zero",			"", submitBufferCountEqualZero);
	addFunctionCase				(commandBuffersTests.get(), "submit_wait_single_semaphore",		"", submitBufferWaitSingleSemaphore);
	addFunctionCase				(commandBuffersTests.get(), "submit_wait_many_semaphores",		"", submitBufferWaitManySemaphores);
	addFunctionCase				(commandBuffersTests.get(), "submit_null_fence",				"", submitBufferNullFence);
	/* 19.5. Secondary Command Buffer Execution (5.6 in VK 1.0 Spec) */
	addFunctionCase				(commandBuffersTests.get(), "secondary_execute",				"",	executeSecondaryBufferTest);
	addFunctionCase				(commandBuffersTests.get(), "secondary_execute_twice",			"",	executeSecondaryBufferTwiceTest);
	/* 19.6. Commands Allowed Inside Command Buffers (? in VK 1.0 Spec) */
	addFunctionCaseWithPrograms (commandBuffersTests.get(), "order_bind_pipeline",				"", genComputeSource, orderBindPipelineTest);

	return commandBuffersTests.release();
}